

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O3

int zt_opt_usage(char *name,char *help,zt_opt_def_t *opts)

{
  zt_opt_callback p_Var1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = "";
  if (help != (char *)0x0) {
    pcVar3 = help;
  }
  printf("Usage: %s %s\nOptions:\n",name,pcVar3);
  p_Var1 = opts->cb;
  while( true ) {
    if (p_Var1 == (zt_opt_callback)0x0) {
      return 0;
    }
    iVar2 = _zt_opt_help_stdout_printer(opts);
    if (iVar2 < 0) break;
    p_Var1 = opts[1].cb;
    opts = opts + 1;
  }
  return -1;
}

Assistant:

int
zt_opt_usage(const char * name, const char * help, zt_opt_def_t * opts) {
    int i;

    printf("Usage: %s %s\nOptions:\n", name, help ? help : "");

    for (i = 0; opts[i].cb != NULL; i++) {
        if (_zt_opt_help_stdout_printer(&opts[i]) < 0) {
            return -1;
        }
    }

    return 0;
}